

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Vec_Wec_t * Gia_ManIsoStrashReduceInt(Gia_Man_t *p,Vec_Wec_t *vSupps,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Wec_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *pVVar3;
  Gia_Man_t *p_03;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  Vec_Int_t *vSizeCount;
  int nSuppMax;
  int iLit;
  int i;
  Vec_Int_t *vMap;
  Vec_Int_t *vSuppOne;
  Vec_Wec_t *vPosEquivs;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int fVerbose_local;
  Vec_Wec_t *vSupps_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_WecAlloc(100);
  p_01 = Vec_IntAlloc(10000);
  iVar1 = Gia_ManCoSuppSizeMax(p,vSupps);
  p_02 = Vec_IntStart(iVar1 + 1);
  for (nSuppMax = 0; iVar2 = Vec_WecSize(vSupps), nSuppMax < iVar2; nSuppMax = nSuppMax + 1) {
    pVVar3 = Vec_WecEntry(vSupps,nSuppMax);
    iVar2 = Vec_IntSize(pVVar3);
    Vec_IntAddToEntry(p_02,iVar2,1);
  }
  Gia_ManFillValue(p);
  iVar2 = Gia_ManObjNum(p);
  p_03 = Gia_ManStart(iVar2);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  for (nSuppMax = 0; nSuppMax < iVar1; nSuppMax = nSuppMax + 1) {
    Gia_ManAppendCi(p_03);
  }
  Gia_ManHashAlloc(p_03);
  nSuppMax = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar5 = false;
    if (nSuppMax < iVar1) {
      vPosEquivs = (Vec_Wec_t *)Gia_ManCo(p,nSuppMax);
      bVar5 = vPosEquivs != (Vec_Wec_t *)0x0;
    }
    if (!bVar5) break;
    pVVar3 = Vec_WecEntry(vSupps,nSuppMax);
    iVar1 = Vec_IntSize(pVVar3);
    iVar1 = Vec_IntEntry(p_02,iVar1);
    if (iVar1 == 1) {
      pVVar3 = Vec_WecPushLevel(p_00);
      Vec_IntPush(pVVar3,nSuppMax);
    }
    else {
      iVar1 = Gia_ManIsoStrashReduceOne(p_03,p,(Gia_Obj_t *)vPosEquivs,pVVar3);
      Vec_IntFillExtra(p_01,iVar1 + 1,-1);
      iVar2 = Vec_IntEntry(p_01,iVar1);
      if (iVar2 == -1) {
        iVar2 = Vec_WecSize(p_00);
        Vec_IntWriteEntry(p_01,iVar1,iVar2);
        pVVar3 = Vec_WecPushLevel(p_00);
        Vec_IntPush(pVVar3,nSuppMax);
      }
      else {
        iVar1 = Vec_IntEntry(p_01,iVar1);
        pVVar3 = Vec_WecEntry(p_00,iVar1);
        Vec_IntPush(pVVar3,nSuppMax);
      }
    }
    nSuppMax = nSuppMax + 1;
  }
  Gia_ManHashStop(p_03);
  Gia_ManStop(p_03);
  Vec_IntFree(p_02);
  Vec_IntFree(p_01);
  return p_00;
}

Assistant:

Vec_Wec_t * Gia_ManIsoStrashReduceInt( Gia_Man_t * p, Vec_Wec_t * vSupps, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Wec_t * vPosEquivs = Vec_WecAlloc( 100 );
    Vec_Int_t * vSuppOne, * vMap = Vec_IntAlloc( 10000 );
    int i, iLit, nSuppMax = Gia_ManCoSuppSizeMax( p, vSupps );
    // count how many times each support size appears
    Vec_Int_t * vSizeCount = Vec_IntStart( nSuppMax + 1 );
    Vec_WecForEachLevel( vSupps, vSuppOne, i )
        Vec_IntAddToEntry( vSizeCount, Vec_IntSize(vSuppOne), 1 );
    // create array of unique outputs
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < nSuppMax; i++ )
        Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
    {
        vSuppOne = Vec_WecEntry( vSupps, i );
        if ( Vec_IntEntry(vSizeCount, Vec_IntSize(vSuppOne)) == 1 )
        {
            Vec_IntPush( Vec_WecPushLevel(vPosEquivs), i );
            continue;
        }
        iLit = Gia_ManIsoStrashReduceOne( pNew, p, pObj, vSuppOne );
        Vec_IntFillExtra( vMap, iLit + 1, -1 );
        if ( Vec_IntEntry(vMap, iLit) == -1 )
        {
            Vec_IntWriteEntry( vMap, iLit, Vec_WecSize(vPosEquivs) );
            Vec_IntPush( Vec_WecPushLevel(vPosEquivs), i );
            continue;
        }
        Vec_IntPush( Vec_WecEntry(vPosEquivs, Vec_IntEntry(vMap, iLit)), i );
    }
    Gia_ManHashStop( pNew );
    Gia_ManStop( pNew );
    Vec_IntFree( vSizeCount );
    Vec_IntFree( vMap );
    return vPosEquivs;
}